

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O0

LinkIndex __thiscall
iDynTree::Traversal::getParentLinkIndexFromJointIndex
          (Traversal *this,Model *model,JointIndex jntIdx)

{
  bool bVar1;
  int iVar2;
  Traversal *this_00;
  undefined4 extraout_var;
  LinkIndex childCandidate;
  JointIndex in_RDI;
  LinkIndex parentLink;
  LinkIndex link2;
  LinkIndex link1;
  IJointConstPtr jnt;
  Model *in_stack_ffffffffffffffc0;
  LinkIndex local_8;
  undefined4 extraout_var_00;
  
  this_00 = (Traversal *)Model::getJoint(in_stack_ffffffffffffffc0,in_RDI);
  if (this_00 == (Traversal *)0x0) {
    local_8 = LINK_INVALID_INDEX;
  }
  else {
    iVar2 = (*(code *)(this_00->links).
                      super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[7])();
    local_8 = CONCAT44(extraout_var,iVar2);
    iVar2 = (*(code *)(this_00->links).
                      super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[8])();
    childCandidate = CONCAT44(extraout_var_00,iVar2);
    bVar1 = isParentOf(this_00,local_8,childCandidate);
    if (!bVar1) {
      local_8 = childCandidate;
    }
  }
  return local_8;
}

Assistant:

LinkIndex Traversal::getParentLinkIndexFromJointIndex(const Model& model, const JointIndex jntIdx) const
{
    // Get the two links connected by this joint
    IJointConstPtr jnt = model.getJoint(jntIdx);
    if (!jnt)
    {
        return LINK_INVALID_INDEX;
    }

    LinkIndex link1 = jnt->getFirstAttachedLink();
    LinkIndex link2 = jnt->getSecondAttachedLink();

    // Get the traversal index of the child link (according to the traversal)
    LinkIndex parentLink;
    if( this->isParentOf(link1,link2) )
    {
        parentLink = link1;
    }
    else
    {
        parentLink = link2;
    }

    return parentLink;
}